

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::AssemblyContext::spvNamedIdAssignOrGet(AssemblyContext *this,char *textValue)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  _Rb_tree_color _Var3;
  bool bVar4;
  iterator iVar5;
  _Rb_tree_color _Var6;
  uint uVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  uint32_t id;
  allocator<char> local_41;
  key_type local_40;
  char *local_20;
  
  local_20 = textValue;
  if ((this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_40._M_dataplus._M_p._0_4_ = _S_red;
    bVar4 = utils::ParseNumber<unsigned_int>(textValue,(uint *)&local_40);
    if ((bVar4) &&
       (p_Var8 = (this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
       p_Var8 != (_Base_ptr)0x0)) {
      p_Var1 = &(this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var1->_M_header;
      do {
        bVar4 = p_Var8[1]._M_color < (_Rb_tree_color)local_40._M_dataplus._M_p;
        if (!bVar4) {
          p_Var9 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[bVar4];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
         (p_Var9[1]._M_color <= (_Rb_tree_color)local_40._M_dataplus._M_p)) goto LAB_001846bc;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,textValue,&local_41);
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_40._M_dataplus._M_p) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_40._M_dataplus._M_p._4_4_,
                             (_Rb_tree_color)local_40._M_dataplus._M_p),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(_Rb_tree_color *)
            ((long)iVar5.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                   ._M_cur + 0x28);
  }
  local_40._M_dataplus._M_p._0_4_ = this->next_id_;
  this->next_id_ = (_Rb_tree_color)local_40._M_dataplus._M_p + _S_black;
  if (((this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var8 = (this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var8 != (_Base_ptr)0x0)) {
    p_Var1 = &(this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header;
    p_Var9 = &p_Var1->_M_header;
    p_Var10 = p_Var8;
    _Var3 = (_Rb_tree_color)local_40._M_dataplus._M_p + _S_black;
    while( true ) {
      do {
        _Var6 = _Var3;
        bVar4 = p_Var10[1]._M_color < (_Rb_tree_color)local_40._M_dataplus._M_p;
        if (!bVar4) {
          p_Var9 = p_Var10;
        }
        pp_Var2 = &p_Var10->_M_left;
        p_Var10 = pp_Var2[bVar4];
        _Var3 = _Var6;
      } while (pp_Var2[bVar4] != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 == p_Var1) ||
         ((_Rb_tree_color)local_40._M_dataplus._M_p < p_Var9[1]._M_color)) break;
      this->next_id_ = _Var6 + _S_black;
      p_Var9 = &p_Var1->_M_header;
      p_Var10 = p_Var8;
      _Var3 = _Var6 + _S_black;
      local_40._M_dataplus._M_p._0_4_ = _Var6;
    }
  }
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const*&,unsigned_int&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&local_20,&local_40);
LAB_001846bc:
  uVar7 = (_Rb_tree_color)local_40._M_dataplus._M_p + _S_black;
  if ((_Rb_tree_color)local_40._M_dataplus._M_p + _S_black < this->bound_) {
    uVar7 = this->bound_;
  }
  this->bound_ = uVar7;
  return (_Rb_tree_color)local_40._M_dataplus._M_p;
}

Assistant:

uint32_t AssemblyContext::spvNamedIdAssignOrGet(const char* textValue) {
  if (!ids_to_preserve_.empty()) {
    uint32_t id = 0;
    if (spvtools::utils::ParseNumber(textValue, &id)) {
      if (ids_to_preserve_.find(id) != ids_to_preserve_.end()) {
        bound_ = std::max(bound_, id + 1);
        return id;
      }
    }
  }

  const auto it = named_ids_.find(textValue);
  if (it == named_ids_.end()) {
    uint32_t id = next_id_++;
    if (!ids_to_preserve_.empty()) {
      while (ids_to_preserve_.find(id) != ids_to_preserve_.end()) {
        id = next_id_++;
      }
    }

    named_ids_.emplace(textValue, id);
    bound_ = std::max(bound_, id + 1);
    return id;
  }

  return it->second;
}